

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

SuspendedRequest * __thiscall
kj::HttpServer::Connection::suspend
          (SuspendedRequest *__return_storage_ptr__,Connection *this,SuspendableRequest *suspendable
          )

{
  uchar *puVar1;
  size_t sVar2;
  StringPtr url;
  Fault FVar3;
  ArrayDisposer *pAVar4;
  uint uVar5;
  long lVar6;
  bool bVar7;
  ArrayPtr<unsigned_char> leftoverParam;
  DebugExpression<bool> _kjCondition;
  ReleasedBuffer released;
  DebugExpression<bool> local_109;
  OneOf<kj::HttpMethod,_kj::HttpConnectMethod> local_108;
  Fault local_f8;
  size_t sStack_f0;
  ArrayDisposer *local_e8;
  uchar *local_e0;
  size_t local_d8;
  Array<unsigned_char> local_c8;
  char *local_a8;
  size_t sStack_a0;
  HttpHeaders local_90;
  
  local_f8.exception = (Exception *)(this->httpInput).headerBuffer.ptr;
  puVar1 = (uchar *)(this->httpInput).leftover.ptr;
  lVar6 = (long)puVar1 -
          ((long)(local_f8.exception)->trace + ((this->httpInput).messageHeaderEnd - 0x68));
  if (lVar6 == 1) {
    bVar7 = puVar1[-1] == '\n';
  }
  else if (((lVar6 != 2) || (puVar1[-1] != '\n')) || (bVar7 = true, puVar1[-2] != '\r')) {
    bVar7 = false;
  }
  if ((this->httpInput).broken == false) {
    local_109.value = (bool)((this->httpInput).headerBuffer.size_ != 0 & bVar7);
    if (local_109.value != false) {
      local_e8 = (this->httpInput).headerBuffer.disposer;
      if (local_e8 == (ArrayDisposer *)0x0) {
        local_f8.exception = (Exception *)0x0;
        sStack_f0 = 0;
        local_e8 = (ArrayDisposer *)0x0;
      }
      else {
        sStack_f0 = (this->httpInput).headerBuffer.size_;
        (this->httpInput).headerBuffer.ptr = (char *)0x0;
        (this->httpInput).headerBuffer.size_ = 0;
      }
      pAVar4 = local_e8;
      sVar2 = (this->httpInput).leftover.size_;
      local_c8.ptr = (uchar *)local_f8.exception;
      local_c8.size_ = sStack_f0;
      local_c8.disposer = local_e8;
      local_f8.exception = (Exception *)0x0;
      sStack_f0 = 0;
      uVar5 = (suspendable->method).tag;
      if (uVar5 == 1) {
        local_108.field_1.space = (byte  [4])*(undefined4 *)&(suspendable->method).field_1;
      }
      local_a8 = (suspendable->url).content.ptr;
      sStack_a0 = (suspendable->url).content.size_;
      local_108.tag = uVar5;
      local_e0 = puVar1;
      local_d8 = sVar2;
      HttpHeaders::cloneShallow(&local_90,suspendable->headers);
      url.content.size_ = sStack_a0;
      url.content.ptr = local_a8;
      leftoverParam.size_ = sVar2;
      leftoverParam.ptr = puVar1;
      SuspendedRequest::SuspendedRequest
                (__return_storage_ptr__,&local_c8,leftoverParam,&local_108,url,&local_90);
      HttpHeaders::~HttpHeaders(&local_90);
      sVar2 = local_c8.size_;
      puVar1 = local_c8.ptr;
      if (uVar5 == 1) {
        local_108.tag = 0;
      }
      uVar5 = 0;
      if (local_108.tag != 2) {
        uVar5 = local_108.tag;
      }
      local_108.tag = uVar5;
      if ((Exception *)local_c8.ptr != (Exception *)0x0) {
        local_c8.ptr = (uchar *)0x0;
        local_c8.size_ = 0;
        (**(local_c8.disposer)->_vptr_ArrayDisposer)(local_c8.disposer,puVar1,1,sVar2,sVar2,0);
      }
      sVar2 = sStack_f0;
      FVar3.exception = local_f8.exception;
      if (local_f8.exception != (Exception *)0x0) {
        local_f8.exception = (Exception *)0x0;
        sStack_f0 = 0;
        (**pAVar4->_vptr_ArrayDisposer)(pAVar4,FVar3.exception,1,sVar2,sVar2,0);
      }
      this->suspended = true;
      return __return_storage_ptr__;
    }
  }
  else {
    local_109.value = false;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[65]>
            (&local_f8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x1d0a,FAILED,"httpInput.canSuspend()",
             "_kjCondition,\"suspend() may only be called before the request body is consumed\"",
             &local_109,
             (char (*) [65])"suspend() may only be called before the request body is consumed");
  kj::_::Debug::Fault::fatal(&local_f8);
}

Assistant:

SuspendedRequest suspend(SuspendableRequest& suspendable) {
    KJ_REQUIRE(httpInput.canSuspend(),
        "suspend() may only be called before the request body is consumed");
    KJ_DEFER(suspended = true);
    auto released = httpInput.releaseBuffer();
    return {
      kj::mv(released.buffer),
      released.leftover,
      suspendable.method,
      suspendable.url,
      suspendable.headers.cloneShallow(),
    };
  }